

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_msgs.c
# Opt level: O0

void voutf(GlobalConfig *config,char *prefix,char *fmt,__va_list_tag *ap)

{
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  char *__s;
  bool bVar4;
  char *local_50;
  size_t cut;
  char *print_buffer;
  char *ptr;
  size_t len;
  size_t width;
  __va_list_tag *ap_local;
  char *fmt_local;
  char *prefix_local;
  GlobalConfig *config_local;
  
  uVar1 = get_terminal_columns();
  sVar2 = strlen(prefix);
  pcVar3 = (char *)(uVar1 - sVar2);
  if (((*(ushort *)&config->field_0x63 >> 8 & 1) == 0) &&
     (__s = (char *)curl_mvaprintf(fmt,ap), __s != (char *)0x0)) {
    ptr = (char *)strlen(__s);
    print_buffer = __s;
    while (ptr != (char *)0x0) {
      fputs(prefix,(FILE *)tool_stderr);
      local_50 = pcVar3;
      if (pcVar3 < ptr) {
        do {
          local_50 = local_50 + -1;
          bVar4 = false;
          if ((print_buffer[(long)local_50] != ' ') &&
             (bVar4 = false, print_buffer[(long)local_50] != '\t')) {
            bVar4 = local_50 != (char *)0x0;
          }
        } while (bVar4);
        if (local_50 == (char *)0x0) {
          local_50 = pcVar3 + -1;
        }
        fwrite(print_buffer,(size_t)(local_50 + 1),1,(FILE *)tool_stderr);
        fputs("\n",(FILE *)tool_stderr);
        print_buffer = local_50 + 1 + (long)print_buffer;
        ptr = ptr + -(long)(local_50 + 1);
      }
      else {
        fputs(print_buffer,(FILE *)tool_stderr);
        fputs("\n",(FILE *)tool_stderr);
        ptr = (char *)0x0;
      }
    }
    curl_free(__s);
  }
  return;
}

Assistant:

static void voutf(struct GlobalConfig *config,
                  const char *prefix,
                  const char *fmt,
                  va_list ap)
{
  size_t width = (get_terminal_columns() - strlen(prefix));
  DEBUGASSERT(!strchr(fmt, '\n'));
  if(!config->silent) {
    size_t len;
    char *ptr;
    char *print_buffer;

    print_buffer = vaprintf(fmt, ap);
    if(!print_buffer)
      return;
    len = strlen(print_buffer);

    ptr = print_buffer;
    while(len > 0) {
      fputs(prefix, tool_stderr);

      if(len > width) {
        size_t cut = width-1;

        while(!ISBLANK(ptr[cut]) && cut) {
          cut--;
        }
        if(0 == cut)
          /* not a single cutting position was found, just cut it at the
             max text width then! */
          cut = width-1;

        (void)fwrite(ptr, cut + 1, 1, tool_stderr);
        fputs("\n", tool_stderr);
        ptr += cut + 1; /* skip the space too */
        len -= cut + 1;
      }
      else {
        fputs(ptr, tool_stderr);
        fputs("\n", tool_stderr);
        len = 0;
      }
    }
    curl_free(print_buffer);
  }
}